

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiImageClearingTests.cpp
# Opt level: O1

void __thiscall
vkt::api::anon_unknown_0::ImageClearingTestInstance::pipelineImageBarrier
          (ImageClearingTestInstance *this,VkPipelineStageFlags srcStageMask,
          VkPipelineStageFlags dstStageMask,VkAccessFlags srcAccessMask,VkAccessFlags dstAccessMask,
          VkImageLayout oldLayout,VkImageLayout newLayout)

{
  VkImageMemoryBarrier imageBarrier;
  
  imageBarrier.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  imageBarrier.pNext = (void *)0x0;
  imageBarrier.newLayout = newLayout;
  imageBarrier.srcQueueFamilyIndex = 0xffffffff;
  imageBarrier.dstQueueFamilyIndex = 0xffffffff;
  imageBarrier.image.m_internal =
       (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  imageBarrier.subresourceRange.aspectMask = this->m_imageAspectFlags;
  imageBarrier.subresourceRange.baseMipLevel = 0;
  imageBarrier.subresourceRange.levelCount = 0xffffffff;
  imageBarrier.subresourceRange.baseArrayLayer = 0;
  imageBarrier.subresourceRange.layerCount = 1;
  imageBarrier.srcAccessMask = srcAccessMask;
  imageBarrier.dstAccessMask = dstAccessMask;
  imageBarrier.oldLayout = oldLayout;
  (*this->m_vkd->_vptr_DeviceInterface[0x6d])
            (this->m_vkd,
             (this->m_commandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             srcStageMask,dstStageMask,0,0,0,0,0,1,&imageBarrier);
  return;
}

Assistant:

void ImageClearingTestInstance::pipelineImageBarrier(VkPipelineStageFlags srcStageMask, VkPipelineStageFlags dstStageMask, VkAccessFlags srcAccessMask, VkAccessFlags dstAccessMask, VkImageLayout oldLayout, VkImageLayout newLayout) const
{
	const VkImageMemoryBarrier		imageBarrier	=
	{
		VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,		// VkStructureType			sType;
		DE_NULL,									// const void*				pNext;
		srcAccessMask,								// VkAccessFlags			srcAccessMask;
		dstAccessMask,								// VkAccessFlags			dstAccessMask;
		oldLayout,									// VkImageLayout			oldLayout;
		newLayout,									// VkImageLayout			newLayout;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32					srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32					destQueueFamilyIndex;
		*m_image,									// VkImage					image;
		{
			m_imageAspectFlags,							// VkImageAspectFlags	aspectMask;
			0u,											// deUint32				baseMipLevel;
			VK_REMAINING_MIP_LEVELS,					// deUint32				levelCount;
			0u,											// deUint32				baseArrayLayer;
			1u,											// deUint32				layerCount;
		},											// VkImageSubresourceRange	subresourceRange;
	};

	m_vkd.cmdPipelineBarrier(*m_commandBuffer, srcStageMask, dstStageMask, 0, 0, DE_NULL, 0, DE_NULL, 1, &imageBarrier);
}